

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::LeastGreatestFunction<double,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  pointer pVVar1;
  pointer pVVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  bool bVar6;
  reference pvVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  ulong uVar12;
  VectorType vector_type_p;
  double ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  double local_8a0;
  Vector *local_898;
  ExpressionState *local_890;
  size_type local_888;
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  pVVar1 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar2 - (long)pVVar1 == 0x68) {
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar7);
    return;
  }
  if (pVVar2 == pVVar1) {
    switchD_00569a20::default(local_838,0,0x800);
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar11 = 0;
    local_898 = result;
    local_890 = state;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
      if (pvVar7->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar11 = sVar11 + 1;
      pVVar1 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (sVar11 < (ulong)(((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5));
    pdVar3 = local_898->data;
    switchD_00569a20::default(local_838,0,0x800);
    result = local_898;
    state = local_890;
    if (pVVar2 != pVVar1) {
      sVar11 = 0;
      do {
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
        if (pvVar7->vector_type == CONSTANT_VECTOR) {
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
          puVar4 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) goto LAB_00f8e460;
        }
        else {
LAB_00f8e460:
          UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
          Vector::ToUnifiedFormat(pvVar7,args->count,&local_880);
          pdVar5 = local_880.data;
          uVar10 = args->count;
          local_888 = sVar11;
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (uVar10 != 0) {
              lVar9 = 0;
              uVar10 = 0;
              do {
                uVar12 = uVar10;
                if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                  uVar12 = (ulong)(local_880.sel)->sel_vector[uVar10];
                }
                local_8a0 = *(double *)(pdVar5 + uVar12 * 8);
                if ((local_838[uVar10] != true) ||
                   (bVar6 = GreaterThan::Operation<double>(&local_8a0,(double *)(pdVar3 + lVar9)),
                   bVar6)) {
                  local_838[uVar10] = true;
                  *(double *)(pdVar3 + uVar10 * 8) = local_8a0;
                }
                uVar10 = uVar10 + 1;
                lVar9 = lVar9 + 8;
              } while (uVar10 < args->count);
            }
          }
          else if (uVar10 != 0) {
            lVar9 = 0;
            uVar12 = 0;
            do {
              uVar8 = uVar12;
              if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                uVar8 = (ulong)(local_880.sel)->sel_vector[uVar12];
              }
              if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0) ||
                 ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
                local_8a0 = *(double *)(pdVar5 + uVar8 * 8);
                if ((local_838[uVar12] != true) ||
                   (bVar6 = GreaterThan::Operation<double>(&local_8a0,(double *)(pdVar3 + lVar9)),
                   bVar6)) {
                  local_838[uVar12] = true;
                  *(double *)(pdVar3 + uVar12 * 8) = local_8a0;
                }
                uVar10 = args->count;
              }
              uVar12 = uVar12 + 1;
              lVar9 = lVar9 + 8;
            } while (uVar12 < uVar10);
          }
          if (local_880.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          sVar11 = local_888;
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        sVar11 = sVar11 + 1;
        result = local_898;
        state = local_890;
      } while (sVar11 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
  }
  StandardLeastGreatest<false>::FinalizeResult(args->count,local_838,result,state);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}